

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintSExpression::visitDefinedFunction(PrintSExpression *this,Function *curr)

{
  undefined1 *puVar1;
  uint uVar2;
  undefined4 *puVar3;
  Expression *pEVar4;
  Function *pFVar5;
  uintptr_t uVar6;
  bool bVar7;
  Index IVar8;
  int iVar9;
  size_t sVar10;
  ostream *poVar11;
  Type type;
  size_t sVar12;
  uint *puVar13;
  undefined1 *puVar14;
  char *pcVar15;
  undefined1 *puVar16;
  long *plVar17;
  char cVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auStack_98 [8];
  SmallVector<unsigned_int,_4UL> catchIndexStack;
  PrintSExpression *local_58;
  Module *local_50;
  undefined1 local_48 [16];
  uint32_t local_38;
  undefined1 local_34;
  
  poVar11 = this->o;
  auStack_98 = (undefined1  [8])&catchIndexStack.fixed;
  std::__cxx11::string::_M_construct((ulong)auStack_98,(char)this->indent);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,(char *)auStack_98,catchIndexStack.usedFixed);
  if (auStack_98 != (undefined1  [8])&catchIndexStack.fixed) {
    operator_delete((void *)auStack_98,
                    CONCAT44(catchIndexStack.fixed._M_elems[1],catchIndexStack.fixed._M_elems[0]) +
                    1);
  }
  this->currFunction = curr;
  if ((this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == true) {
    (this->lastPrintedLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
  }
  this->lastPrintIndent = 0;
  if ((curr->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == true) {
    catchIndexStack.fixed._M_elems[0] =
         *(uint *)((long)&(curr->prologLocation).
                          super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload
                          .super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                          _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> +
                  4);
    auStack_98 = *(undefined1 (*) [8])
                  &(curr->prologLocation).
                   super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload;
    catchIndexStack.usedFixed =
         *(size_t *)
          ((long)&(curr->prologLocation).
                  super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8);
    catchIndexStack.fixed._M_elems[1] = CONCAT31(catchIndexStack.fixed._M_elems[1]._1_3_,1);
    printDebugLocation(this,(optional<wasm::Function::DebugLocation> *)auStack_98);
  }
  handleSignature(this,curr,true);
  incIndent(this);
  IVar8 = Function::getVarIndexBase(curr);
  uVar20 = (ulong)IVar8;
  sVar10 = Function::getNumLocals(curr);
  if (uVar20 < sVar10) {
    do {
      poVar11 = this->o;
      auStack_98 = (undefined1  [8])&catchIndexStack.fixed;
      std::__cxx11::string::_M_construct((ulong)auStack_98,(char)this->indent);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,(char *)auStack_98,catchIndexStack.usedFixed);
      if (auStack_98 != (undefined1  [8])&catchIndexStack.fixed) {
        operator_delete((void *)auStack_98,
                        CONCAT44(catchIndexStack.fixed._M_elems[1],catchIndexStack.fixed._M_elems[0]
                                ) + 1);
      }
      auStack_98[0] = 0x28;
      std::__ostream_insert<char,std::char_traits<char>>(this->o,auStack_98,1);
      poVar11 = this->o;
      Colors::outputColorCode(poVar11,"\x1b[33m");
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"local ",6);
      Colors::outputColorCode(poVar11,"\x1b[0m");
      poVar11 = anon_unknown_0::printLocal((Index)uVar20,this->currFunction,this->o);
      auStack_98[0] = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,auStack_98,1);
      type = Function::getLocalType(curr,(Index)uVar20);
      poVar11 = printType(this,type);
      auStack_98[0] = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,auStack_98,1);
      poVar11 = this->o;
      pcVar15 = this->maybeNewLine;
      if (pcVar15 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(*(long *)poVar11 + -0x18) + (int)poVar11);
      }
      else {
        sVar12 = strlen(pcVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar15,sVar12);
      }
      uVar20 = uVar20 + 1;
      sVar10 = Function::getNumLocals(curr);
    } while (uVar20 < sVar10);
  }
  if ((this->moduleStackIR).super__Optional_base<wasm::ModuleStackIR,_false,_false>._M_payload.
      super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
      super__Optional_payload_base<wasm::ModuleStackIR>._M_engaged == false) {
    plVar17 = (long *)0x0;
  }
  else {
    puVar1 = (this->moduleStackIR).super__Optional_base<wasm::ModuleStackIR,_false,_false>.
             _M_payload.super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
             super__Optional_payload_base<wasm::ModuleStackIR>._M_payload.field2 + 0x10;
    puVar14 = puVar1;
    for (puVar16 = *(undefined1 **)
                    ((long)&(this->moduleStackIR).
                            super__Optional_base<wasm::ModuleStackIR,_false,_false>._M_payload.
                            super__Optional_payload<wasm::ModuleStackIR,_true,_false,_false>.
                            super__Optional_payload_base<wasm::ModuleStackIR>._M_payload._M_value.
                            analysis + 0x18); puVar16 != (undefined1 *)0x0;
        puVar16 = *(undefined1 **)
                   (puVar16 + (ulong)(*(Function **)(puVar16 + 0x20) < curr) * 8 + 0x10)) {
      if (*(Function **)(puVar16 + 0x20) >= curr) {
        puVar14 = puVar16;
      }
    }
    puVar16 = puVar1;
    if ((puVar14 != puVar1) && (puVar16 = puVar14, curr < *(Function **)(puVar14 + 0x20))) {
      puVar16 = puVar1;
    }
    plVar17 = (long *)0x0;
    if (puVar16 != puVar1) {
      plVar17 = (long *)(puVar16 + 0x28);
    }
  }
  if (plVar17 == (long *)0x0) {
    if (((this->full == false) && (pEVar4 = curr->body, pEVar4->_id == BlockId)) &&
       (pEVar4[1].type.id == 0)) {
      uVar6 = pEVar4[2].type.id;
      if (uVar6 != 0) {
        uVar20 = 0;
        do {
          if (pEVar4[2].type.id <= uVar20) {
            pcVar15 = 
            "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
            ;
            goto LAB_00a3a752;
          }
          printFullLine(this,*(Expression **)(*(long *)(pEVar4 + 2) + uVar20 * 8));
          uVar20 = uVar20 + 1;
        } while (uVar6 != uVar20);
      }
    }
    else {
      printFullLine(this,curr->body);
    }
    if (this->controlFlowDepth != 0) {
      __assert_fail("controlFlowDepth == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                    ,0xc82,"void wasm::PrintSExpression::visitDefinedFunction(Function *)");
    }
  }
  else {
    poVar11 = this->o;
    auStack_98 = (undefined1  [8])0x0;
    catchIndexStack.fixed._M_elems[2] = 0;
    catchIndexStack.fixed._M_elems[3] = 0;
    catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar19 = *plVar17;
    if (plVar17[1] != lVar19) {
      iVar9 = 0;
      cVar18 = (this->currFunction != (Function *)0x0) * '\x02';
      uVar20 = 0;
      uVar21 = 1;
      do {
        puVar3 = *(undefined4 **)(lVar19 + uVar20 * 8);
        if (puVar3 == (undefined4 *)0x0) goto LAB_00a3a50e;
        switch(*puVar3) {
        case 0:
          local_58 = (PrintSExpression *)local_48;
          std::__cxx11::string::_M_construct((ulong)&local_58,cVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,(char *)local_58,(long)local_50);
          if (local_58 != (PrintSExpression *)local_48) {
            operator_delete(local_58,(ulong)((long)&(((Importable *)local_48._0_8_)->super_Named).
                                                    name.super_IString.str._M_len + 1));
          }
          if (**(char **)(puVar3 + 2) != '(') {
            local_50 = this->currModule;
            local_48._0_8_ = this->currFunction;
            local_48._8_8_ = this->o;
            if (local_50 == (Module *)0x0) {
              local_38 = 0x3fffff;
            }
            else {
              local_38 = (local_50->features).features;
            }
            local_58 = this;
            local_34 = anon_unknown_0::isFullForced();
            Visitor<wasm::PrintExpressionContents,_void>::visit
                      ((Visitor<wasm::PrintExpressionContents,_void> *)&local_58,
                       *(Expression **)(puVar3 + 2));
          }
          break;
        case 4:
          local_58 = (PrintSExpression *)local_48;
          std::__cxx11::string::_M_construct((ulong)&local_58,cVar18 + -1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,(char *)local_58,(long)local_50);
          if (local_58 != (PrintSExpression *)local_48) {
            operator_delete(local_58,(ulong)((long)&(((Importable *)local_48._0_8_)->super_Named).
                                                    name.super_IString.str._M_len + 1));
          }
          Colors::outputColorCode(poVar11,"\x1b[35m");
          lVar19 = 4;
          Colors::outputColorCode(poVar11,"\x1b[1m");
          pcVar15 = "else";
          goto LAB_00a3a36d;
        case 8:
          local_58 = (PrintSExpression *)((ulong)local_58 & 0xffffffff00000000);
          SmallVector<unsigned_int,_4UL>::push_back
                    ((SmallVector<unsigned_int,_4UL> *)auStack_98,(uint *)&local_58);
        case 1:
        case 3:
        case 6:
        case 0xd:
          local_58 = (PrintSExpression *)local_48;
          std::__cxx11::string::_M_construct((ulong)&local_58,cVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,(char *)local_58,(long)local_50);
          if (local_58 != (PrintSExpression *)local_48) {
            operator_delete(local_58,(ulong)((long)&(((Importable *)local_48._0_8_)->super_Named).
                                                    name.super_IString.str._M_len + 1));
          }
          local_50 = this->currModule;
          local_48._0_8_ = this->currFunction;
          local_48._8_8_ = this->o;
          if (local_50 == (Module *)0x0) {
            local_38 = 0x3fffff;
          }
          else {
            local_38 = (local_50->features).features;
          }
          local_58 = this;
          local_34 = anon_unknown_0::isFullForced();
          Visitor<wasm::PrintExpressionContents,_void>::visit
                    ((Visitor<wasm::PrintExpressionContents,_void> *)&local_58,
                     *(Expression **)(puVar3 + 2));
          iVar9 = iVar9 + 1;
          cVar18 = cVar18 + '\x01';
          break;
        case 9:
          local_58 = (PrintSExpression *)local_48;
          std::__cxx11::string::_M_construct((ulong)&local_58,cVar18 + -1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,(char *)local_58,(long)local_50);
          if (local_58 != (PrintSExpression *)local_48) {
            operator_delete(local_58,(ulong)((long)&(((Importable *)local_48._0_8_)->super_Named).
                                                    name.super_IString.str._M_len + 1));
          }
          Colors::outputColorCode(poVar11,"\x1b[35m");
          Colors::outputColorCode(poVar11,"\x1b[1m");
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"catch ",6);
          Colors::outputColorCode(poVar11,"\x1b[0m");
          pcVar15 = *(char **)(puVar3 + 2);
          if (*pcVar15 != '4') {
LAB_00a3a6ef:
            __assert_fail("int(_id) == int(T::SpecificId)",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                          ,0x31b,"T *wasm::Expression::cast() [T = wasm::Try]");
          }
          puVar13 = SmallVector<unsigned_int,_4UL>::back
                              ((SmallVector<unsigned_int,_4UL> *)auStack_98);
          uVar2 = *puVar13;
          *puVar13 = uVar2 + 1;
          if (*(ulong *)(pcVar15 + 0x30) <= (ulong)uVar2) {
            pcVar15 = 
            "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
            ;
LAB_00a3a752:
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xbc,pcVar15);
          }
          Name::print((Name *)((ulong)uVar2 * 0x10 + *(long *)(pcVar15 + 0x28)),poVar11);
          break;
        case 10:
          local_58 = (PrintSExpression *)local_48;
          std::__cxx11::string::_M_construct((ulong)&local_58,cVar18 + -1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,(char *)local_58,(long)local_50);
          if (local_58 != (PrintSExpression *)local_48) {
            operator_delete(local_58,(ulong)((long)&(((Importable *)local_48._0_8_)->super_Named).
                                                    name.super_IString.str._M_len + 1));
          }
          Colors::outputColorCode(poVar11,"\x1b[35m");
          lVar19 = 9;
          Colors::outputColorCode(poVar11,"\x1b[1m");
          pcVar15 = "catch_all";
LAB_00a3a36d:
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar15,lVar19);
          Colors::outputColorCode(poVar11,"\x1b[0m");
          break;
        case 0xb:
          cVar18 = cVar18 + -1;
          local_58 = (PrintSExpression *)local_48;
          std::__cxx11::string::_M_construct((ulong)&local_58,cVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,(char *)local_58,(long)local_50);
          if (local_58 != (PrintSExpression *)local_48) {
            operator_delete(local_58,(ulong)((long)&(((Importable *)local_48._0_8_)->super_Named).
                                                    name.super_IString.str._M_len + 1));
          }
          Colors::outputColorCode(poVar11,"\x1b[35m");
          Colors::outputColorCode(poVar11,"\x1b[1m");
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"delegate ",9);
          Colors::outputColorCode(poVar11,"\x1b[0m");
          pcVar15 = *(char **)(puVar3 + 2);
          if (*pcVar15 != '4') goto LAB_00a3a6ef;
          iVar9 = iVar9 + -1;
          if (*(long *)(pcVar15 + 0x70) == DAT_010d2868) {
            std::ostream::operator<<(poVar11,iVar9);
          }
          else {
            Name::print((Name *)(pcVar15 + 0x68),poVar11);
          }
          break;
        case 0xc:
          if ((pointer)catchIndexStack.fixed._M_elems._8_8_ ==
              catchIndexStack.flexible.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start) {
            if (auStack_98 == (undefined1  [8])0x0) {
              __assert_fail("usedFixed > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                            ,0x75,
                            "void wasm::SmallVector<unsigned int, 4>::pop_back() [T = unsigned int, N = 4]"
                           );
            }
            auStack_98 = (undefined1  [8])((long)auStack_98 + -1);
          }
          else {
            catchIndexStack.flexible.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 catchIndexStack.flexible.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + -1;
          }
        case 2:
        case 5:
        case 7:
        case 0xe:
          cVar18 = cVar18 + -1;
          local_58 = (PrintSExpression *)local_48;
          std::__cxx11::string::_M_construct((ulong)&local_58,cVar18);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,(char *)local_58,(long)local_50);
          if (local_58 != (PrintSExpression *)local_48) {
            operator_delete(local_58,(ulong)((long)&(((Importable *)local_48._0_8_)->super_Named).
                                                    name.super_IString.str._M_len + 1));
          }
          Colors::outputColorCode(poVar11,"\x1b[35m");
          Colors::outputColorCode(poVar11,"\x1b[1m");
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"end",3);
          Colors::outputColorCode(poVar11,"\x1b[0m");
          iVar9 = iVar9 + -1;
          break;
        default:
          handle_unreachable("unexpeted op",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                             ,0xecf);
        }
        local_58 = (PrintSExpression *)CONCAT71(local_58._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_58,1);
LAB_00a3a50e:
        lVar19 = *plVar17;
        bVar7 = uVar21 < (ulong)(plVar17[1] - lVar19 >> 3);
        uVar20 = uVar21;
        uVar21 = (ulong)((int)uVar21 + 1);
      } while (bVar7);
      if (iVar9 != 0) {
        __assert_fail("controlFlowDepth == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                      ,0xed3,"std::ostream &wasm::printStackIR(StackIR *, PrintSExpression &)");
      }
    }
    if (catchIndexStack.fixed._M_elems._8_8_ != 0) {
      operator_delete((void *)catchIndexStack.fixed._M_elems._8_8_,
                      (long)catchIndexStack.flexible.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - catchIndexStack.fixed._M_elems._8_8_
                     );
    }
  }
  if ((this->currFunction->epilogLocation).
      super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged == true) {
    poVar11 = this->o;
    auStack_98 = (undefined1  [8])&catchIndexStack.fixed;
    std::__cxx11::string::_M_construct((ulong)auStack_98,(char)this->indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,(char *)auStack_98,catchIndexStack.usedFixed);
    if (auStack_98 != (undefined1  [8])&catchIndexStack.fixed) {
      operator_delete((void *)auStack_98,
                      CONCAT44(catchIndexStack.fixed._M_elems[1],catchIndexStack.fixed._M_elems[0])
                      + 1);
    }
    if (this->minify == false) {
      this->indent = this->indent - 1;
    }
    pFVar5 = this->currFunction;
    catchIndexStack.fixed._M_elems[0] =
         *(uint *)((long)&(pFVar5->epilogLocation).
                          super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload
                          .super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload.
                          _M_value.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true> +
                  4);
    auStack_98 = *(undefined1 (*) [8])
                  &(pFVar5->epilogLocation).
                   super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload;
    catchIndexStack.usedFixed =
         *(size_t *)
          ((long)&(pFVar5->epilogLocation).
                  super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload + 8);
    catchIndexStack.fixed._M_elems[1] = CONCAT31(catchIndexStack.fixed._M_elems[1]._1_3_,1);
    printDebugLocation(this,(optional<wasm::Function::DebugLocation> *)auStack_98);
    auStack_98[0] = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>(this->o,auStack_98,1);
  }
  else {
    decIndent(this);
  }
  poVar11 = this->o;
  pcVar15 = this->maybeNewLine;
  if (pcVar15 == (char *)0x0) {
    std::ios::clear((int)poVar11 + (int)*(undefined8 *)(*(long *)poVar11 + -0x18));
  }
  else {
    sVar12 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar15,sVar12);
  }
  return;
}

Assistant:

void PrintSExpression::visitDefinedFunction(Function* curr) {
  doIndent(o, indent);
  currFunction = curr;
  lastPrintedLocation = std::nullopt;
  lastPrintIndent = 0;
  if (currFunction->prologLocation) {
    printDebugLocation(*currFunction->prologLocation);
  }
  handleSignature(curr, true);
  incIndent();
  for (size_t i = curr->getVarIndexBase(); i < curr->getNumLocals(); i++) {
    doIndent(o, indent);
    o << '(';
    printMinor(o, "local ");
    printLocal(i, currFunction, o) << ' ';
    printType(curr->getLocalType(i)) << ')';
    o << maybeNewLine;
  }
  // Print the body.
  StackIR* stackIR = nullptr;
  if (moduleStackIR) {
    stackIR = moduleStackIR->getStackIROrNull(curr);
  }
  if (stackIR) {
    printStackIR(stackIR, *this);
  } else {
    // It is ok to emit a block here, as a function can directly contain a
    // list, even if our ast avoids that for simplicity. We can just do that
    // optimization here..
    if (!full && curr->body->is<Block>() &&
        curr->body->cast<Block>()->name.isNull()) {
      Block* block = curr->body->cast<Block>();
      for (auto item : block->list) {
        printFullLine(item);
      }
    } else {
      printFullLine(curr->body);
    }
    assert(controlFlowDepth == 0);
  }
  if (currFunction->epilogLocation) {
    // Print last debug location: mix of decIndent and printDebugLocation
    // logic.
    doIndent(o, indent);
    if (!minify) {
      indent--;
    }
    printDebugLocation(*currFunction->epilogLocation);
    o << ')';
  } else {
    decIndent();
  }
  o << maybeNewLine;
}